

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDie.cpp
# Opt level: O0

bool __thiscall
llvm::DWARFDie::getLowAndHighPC
          (DWARFDie *this,uint64_t *LowPC,uint64_t *HighPC,uint64_t *SectionIndex)

{
  bool bVar1;
  SectionedAddress *pSVar2;
  unsigned_long *puVar3;
  Optional<unsigned_long> OVar4;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_90;
  Optional<unsigned_long> HighPcAddr;
  Optional<llvm::object::SectionedAddress> LowPcAddr;
  Optional<llvm::DWARFFormValue> F;
  uint64_t *SectionIndex_local;
  uint64_t *HighPC_local;
  uint64_t *LowPC_local;
  DWARFDie *this_local;
  
  find((Optional<llvm::DWARFFormValue> *)&LowPcAddr.Storage.hasVal,this,DW_AT_low_pc);
  dwarf::toSectionedAddress
            ((Optional<llvm::object::SectionedAddress> *)&HighPcAddr.Storage.hasVal,
             (Optional<llvm::DWARFFormValue> *)&LowPcAddr.Storage.hasVal);
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&HighPcAddr.Storage.hasVal);
  if (bVar1) {
    pSVar2 = Optional<llvm::object::SectionedAddress>::operator->
                       ((Optional<llvm::object::SectionedAddress> *)&HighPcAddr.Storage.hasVal);
    OVar4 = getHighPC(this,pSVar2->Address);
    local_90 = OVar4.Storage.field_0;
    HighPcAddr.Storage.field_0.empty = OVar4.Storage.hasVal;
    bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&local_90.empty);
    if (bVar1) {
      pSVar2 = Optional<llvm::object::SectionedAddress>::operator->
                         ((Optional<llvm::object::SectionedAddress> *)&HighPcAddr.Storage.hasVal);
      *LowPC = pSVar2->Address;
      puVar3 = Optional<unsigned_long>::operator*((Optional<unsigned_long> *)&local_90);
      *HighPC = *puVar3;
      pSVar2 = Optional<llvm::object::SectionedAddress>::operator->
                         ((Optional<llvm::object::SectionedAddress> *)&HighPcAddr.Storage.hasVal);
      *SectionIndex = pSVar2->SectionIndex;
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool DWARFDie::getLowAndHighPC(uint64_t &LowPC, uint64_t &HighPC,
                               uint64_t &SectionIndex) const {
  auto F = find(DW_AT_low_pc);
  auto LowPcAddr = toSectionedAddress(F);
  if (!LowPcAddr)
    return false;
  if (auto HighPcAddr = getHighPC(LowPcAddr->Address)) {
    LowPC = LowPcAddr->Address;
    HighPC = *HighPcAddr;
    SectionIndex = LowPcAddr->SectionIndex;
    return true;
  }
  return false;
}